

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O1

bool __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_ConcatenatedWrite
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this,
          CNodeWriteConcatenator *pConcatenatedWrite,bool featureStreaming,
          gcstring_vector *pErrorList)

{
  INodeMap *pIVar1;
  undefined1 uVar2;
  ExceptionReporter<GenICam_3_4::AccessException> *this_00;
  ExceptionReporter<GenICam_3_4::AccessException> local_c0;
  
  pIVar1 = this->_Ptr;
  if (pIVar1 != (INodeMap *)0x0) {
    uVar2 = (**(code **)(*(long *)pIVar1 + 0x68))(pIVar1,pConcatenatedWrite,featureStreaming);
    return (bool)uVar2;
  }
  this_00 = (ExceptionReporter<GenICam_3_4::AccessException> *)__cxa_allocate_exception(0x1f0);
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::ExceptionReporter
            (&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rc_genicam_api/genicam/library/CPP/include/GenApi/NodeMapRef.h"
             ,0x1d1,"AccessException");
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::Report
            (this_00,(char *)&local_c0,"Feature not present (reference not valid)");
  __cxa_throw(this_00,&GenICam_3_4::AccessException::typeinfo,
              GenICam_3_4::GenericException::~GenericException);
}

Assistant:

inline bool CNodeMapRefT<TCameraParams>::_ConcatenatedWrite(CNodeWriteConcatenator* pConcatenatedWrite, bool featureStreaming, GENICAM_NAMESPACE::gcstring_vector* pErrorList)
    {
        if (_Ptr)
            return _Ptr->ConcatenatedWrite(pConcatenatedWrite, featureStreaming, pErrorList);
        throw ACCESS_EXCEPTION("Feature not present (reference not valid)");
    }